

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,decimal_fp<double> *fp,
          basic_format_specs<char16_t> *specs,float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  char cVar2;
  byte bVar3;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar4;
  byte *pbVar5;
  long lVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  char16_t decimal_point;
  bool pointy;
  char16_t zero;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_40_8_70a3e612 write;
  undefined1 local_d6 [26];
  sign_t local_bc;
  float_specs local_b8;
  undefined1 local_ac [8];
  int iStack_a4;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  short local_88;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_80;
  anon_class_72_9_d68ba176 local_78;
  
  local_b8 = (float_specs)fp->significand;
  lVar6 = 0x3f;
  if (((ulong)local_b8 | 1) != 0) {
    for (; ((ulong)local_b8 | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  local_d6._10_4_ =
       (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar6] -
       (uint)((ulong)local_b8 <
             (ulong)*(float_specs *)
                     (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                     (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar6] * 8));
  local_d6._8_2_ = 0x30;
  local_d6._18_4_ = fspecs._4_4_;
  local_bc = (uint)local_d6._18_4_ >> 8 & 0xff;
  fVar1 = fspecs;
  if ((int)local_d6._10_4_ < 0) goto LAB_00162e61;
  uVar13 = (local_d6._10_4_ + 1) - (uint)(local_bc == 0);
  uVar11 = (ulong)uVar13;
  local_d6._0_2_ = L'.';
  uVar9 = (uint)local_d6._18_4_ >> 0x11;
  local_d6._14_8_ = fspecs;
  if ((uVar9 & 1) != 0) {
    cVar2 = fmt::v8::detail::decimal_point_impl<char>(loc);
    local_d6._0_2_ = SEXT12(cVar2);
  }
  iVar8 = fp->exponent;
  local_ac._0_4_ = local_d6._10_4_ + iVar8;
  if (SUB81(local_d6._14_8_,4) == '\x01') {
LAB_00162bbc:
    iVar8 = local_d6._10_4_ + iVar8 + -1;
    if (((uint)local_d6._18_4_ >> 0x14 & 1) == 0) {
      iVar10 = 0;
      if (local_d6._10_4_ == 1) {
        local_d6._0_2_ = L'\0';
        iVar10 = 0;
      }
    }
    else {
      iVar10 = 0;
      if (0 < (int)(local_d6._14_4_ - local_d6._10_4_)) {
        iVar10 = local_d6._14_4_ - local_d6._10_4_;
      }
      uVar11 = (ulong)(uVar13 + iVar10);
    }
    local_78.sign = (sign_t *)CONCAT44(local_78.sign._4_4_,local_bc);
    local_78.significand = (significand_type *)local_b8;
    local_78.significand_size._0_6_ = CONCAT24(local_d6._0_2_,local_d6._10_4_);
    local_78.fp._0_6_ = CONCAT24(0x30,iVar10);
    local_78.fp = (decimal_fp<double> *)
                  (CONCAT17(local_78.fp._7_1_,
                            CONCAT16((((uint)local_d6._18_4_ >> 0x10 & 1) == 0) << 5,
                                     local_78.fp._0_6_)) | 0x45000000000000);
    local_78.grouping = (digit_grouping<char16_t> *)CONCAT44(local_78.grouping._4_4_,iVar8);
    if (specs->width < 1) {
      bVar4 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char16_t,_fmt::v8::detail::digit_grouping<char16_t>_>
              ::anon_class_40_8_70a3e612::operator()
                        ((anon_class_40_8_70a3e612 *)&local_78,out.container);
    }
    else {
      if ((int)local_ac._0_4_ < 1) {
        iVar8 = 1 - local_ac._0_4_;
      }
      lVar6 = 2;
      if (99 < iVar8) {
        lVar6 = (ulong)(999 < iVar8) + 3;
      }
      sVar12 = uVar11 + lVar6 + (3 - (ulong)(local_d6._0_2_ == L'\0'));
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        (out,specs,sVar12,sVar12,(anon_class_40_8_70a3e612 *)&local_78);
    }
  }
  else {
    if ((local_d6._14_8_ & 0xff00000000) == 0) {
      iVar10 = 0x10;
      if (0 < (int)local_d6._14_4_) {
        iVar10 = local_d6._14_4_;
      }
      if (((int)local_ac._0_4_ < -3) || (iVar10 < (int)local_ac._0_4_)) goto LAB_00162bbc;
    }
    if (iVar8 < 0) {
      if ((int)local_ac._0_4_ < 1) {
        iVar8 = -local_ac._0_4_;
        local_ac._4_4_ = iVar8;
        if (SBORROW4(local_d6._14_4_,iVar8) != (int)(local_d6._14_4_ + local_ac._0_4_) < 0) {
          local_ac._4_4_ = local_d6._14_4_;
        }
        if ((int)local_d6._14_4_ < 0) {
          local_ac._4_4_ = iVar8;
        }
        if (local_d6._10_4_ != 0) {
          local_ac._4_4_ = iVar8;
        }
        bVar3 = 1;
        if (local_d6._10_4_ == 0 && local_ac._4_4_ == 0) {
          bVar3 = (local_d6[0x14] & 0x10) >> 4;
        }
        local_d6[2] = bVar3;
        fVar1 = (float_specs)local_d6._14_8_;
        if (-1 < (int)local_ac._4_4_) {
          sVar12 = ((uint)bVar3 + local_ac._4_4_ + 1) + uVar11;
          local_78.sign = &local_bc;
          local_78.significand = (significand_type *)(local_d6 + 8);
          local_78.significand_size = (int *)(local_d6 + 2);
          local_78.fp = (decimal_fp<double> *)local_d6;
          local_78.grouping = (digit_grouping<char16_t> *)(local_ac + 4);
          local_78.fspecs = &local_b8;
          local_78.decimal_point = (char16_t *)(local_d6 + 10);
          bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_&>
                            (out,specs,sVar12,sVar12,(anon_class_56_7_162c6e41 *)&local_78);
          return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar4.container;
        }
LAB_00162e61:
        local_d6._14_8_ = fVar1;
        fmt::v8::detail::assert_fail
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                   ,0x195,"negative value");
      }
      uVar13 = 0;
      local_d6._2_4_ = local_d6._14_4_ - local_d6._10_4_ & (int)(local_d6._18_4_ << 0xb) >> 0x1f;
      uVar9 = local_d6._2_4_;
      if ((int)local_d6._2_4_ < 1) {
        uVar9 = uVar13;
      }
      local_80.container = out.container;
      digit_grouping<char16_t>::digit_grouping
                ((digit_grouping<char16_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_d6._18_4_ >> 0x11) & 1));
      pbVar5 = (byte *)CONCAT44(iStack_a4,local_ac._4_4_);
      pbVar7 = pbVar5 + local_a0;
      sVar12 = uVar9 + uVar11;
      do {
        uVar9 = 0x7fffffff;
        if (local_88 != 0) {
          if (pbVar5 == pbVar7) {
            uVar9 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar3 = *pbVar5;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_00162d33;
            pbVar5 = pbVar5 + 1;
            uVar9 = (uint)bVar3;
          }
          uVar13 = uVar13 + uVar9;
          uVar9 = uVar13;
        }
LAB_00162d33:
        sVar12 = sVar12 + 1;
      } while ((int)uVar9 < (int)local_d6._10_4_);
      local_78.sign = &local_bc;
      local_78.significand = (significand_type *)&local_b8;
      local_78.significand_size = (int *)(local_d6 + 10);
      local_78.fp = (decimal_fp<double> *)local_ac;
      local_78.grouping = (digit_grouping<char16_t> *)local_d6;
      local_78.decimal_point = (char16_t *)(local_d6 + 2);
      local_78.num_zeros = (int *)(local_d6 + 8);
      local_78.fspecs = (float_specs *)(local_ac + 4);
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_&>
                        (local_80,specs,sVar12,sVar12,(anon_class_64_8_e6ffa566 *)&local_78);
    }
    else {
      uVar11 = (ulong)(iVar8 + uVar13);
      local_d6._2_4_ = local_d6._14_4_ - local_ac._0_4_;
      if (((uint)local_d6._18_4_ >> 0x14 & 1) != 0) {
        if (SUB81(local_d6._14_8_,4) != '\x02' && (int)local_d6._2_4_ < 1) {
          local_d6._2_4_ = 1;
        }
        if (0 < (int)local_d6._2_4_) {
          uVar11 = uVar11 + (uint)local_d6._2_4_ + 1;
        }
      }
      digit_grouping<char16_t>::digit_grouping
                ((digit_grouping<char16_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_d6._18_4_ >> 0x11) & 1));
      pbVar5 = (byte *)CONCAT44(iStack_a4,local_ac._4_4_);
      pbVar7 = pbVar5 + local_a0;
      sVar12 = uVar11 - 1;
      iVar8 = 0;
      do {
        iVar10 = 0x7fffffff;
        if (local_88 != 0) {
          if (pbVar5 == pbVar7) {
            uVar9 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar3 = *pbVar5;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_00162b53;
            pbVar5 = pbVar5 + 1;
            uVar9 = (uint)bVar3;
          }
          iVar8 = iVar8 + uVar9;
          iVar10 = iVar8;
        }
LAB_00162b53:
        sVar12 = sVar12 + 1;
      } while (iVar10 < (int)local_d6._10_4_);
      local_78.sign = &local_bc;
      local_78.significand = (significand_type *)&local_b8;
      local_78.significand_size = (int *)(local_d6 + 10);
      local_78.fspecs = (float_specs *)(local_d6 + 0xe);
      local_78.decimal_point = (char16_t *)local_d6;
      local_78.num_zeros = (int *)(local_d6 + 2);
      local_78.zero = (char16_t *)(local_d6 + 8);
      local_78.fp = fp;
      local_78.grouping = (digit_grouping<char16_t> *)(local_ac + 4);
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_&>
                        (out,specs,sVar12,sVar12,&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(iStack_a4,local_ac._4_4_) != &local_98) {
      operator_delete((undefined1 *)CONCAT44(iStack_a4,local_ac._4_4_),
                      local_98._M_allocated_capacity + 1);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}